

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,double kappa,double delta,double theta)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Head_base<0UL,_double_*,_false> _Var6;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  double *pdVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
  _Var11;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
  _Var12;
  rc_data *prVar13;
  undefined8 extraout_RAX;
  int iVar14;
  ulong uVar15;
  _Head_base<0UL,_int_*,_false> _Var16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int *piVar20;
  type it;
  long lVar21;
  long lVar22;
  ulong uVar23;
  rc_data *ret;
  _Head_base<0UL,_int_*,_false> _Var24;
  long lVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 in_XMM4_Qb;
  int local_b4;
  double local_b0;
  undefined1 local_88 [16];
  _Head_base<0UL,_int_*,_false> local_78;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  *local_70;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_68;
  double local_60;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_58;
  pair<int,_int> *local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current != last._M_current) {
    local_68._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )((long)this + 8);
    dVar27 = kappa / (1.0 - kappa);
    local_70 = (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this;
    local_60 = theta;
    local_58._M_head_impl = (col_value *)last._M_current;
    do {
      _Var24._M_head_impl = (int *)(long)((col_value *)first._M_current)->value;
      if (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
            *)this)->m <= ((col_value *)first._M_current)->value) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        goto LAB_001a1b8b;
      }
      local_50 = first._M_current;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_88,
                 (int)local_68._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                      _M_head_impl);
      uVar15 = 0;
      local_b4 = 0;
      local_78._M_head_impl = _Var24._M_head_impl;
      if (local_88._8_8_ != local_88._0_8_) {
        _Var6._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
        _Var16._M_head_impl = (int *)local_88._8_8_;
        do {
          iVar18 = *_Var16._M_head_impl;
          _Var16._M_head_impl = _Var16._M_head_impl + 8;
          _Var6._M_head_impl[iVar18] = local_60 * _Var6._M_head_impl[iVar18];
        } while (_Var16._M_head_impl != (int *)local_88._0_8_);
        uVar15 = 0;
        if (local_88._8_8_ != local_88._0_8_) {
          uVar10 = 1;
          uVar15 = 0;
          piVar20 = (int *)local_88._8_8_;
          do {
            uVar17 = uVar15;
            uVar23 = (ulong)uVar10;
            sparse_matrix<int>::column
                      ((sparse_matrix<int> *)&local_40,
                       (int)local_68._M_t.
                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                            .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                            ._M_head_impl);
            _Var24._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl
                == (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              local_b0 = 0.0;
            }
            else {
              auVar37 = ZEXT864(0) << 0x40;
              do {
                iVar18 = *local_38._M_head_impl;
                local_38._M_head_impl = local_38._M_head_impl + 2;
                auVar29._0_8_ = (double)_Var24._M_head_impl[iVar18];
                auVar29._8_8_ = in_XMM4_Qb;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                                  *)this)->P)._M_t.
                               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                               super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar18];
                auVar2 = vfmadd231sd_fma(auVar37._0_16_,auVar29,auVar2);
                auVar37 = ZEXT1664(auVar2);
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_38._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
              local_b0 = auVar2._0_8_;
            }
            _Var12._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            *(int *)((long)(_Var12._M_head_impl + uVar17) + 8) = (int)uVar17;
            *(int *)((long)(_Var12._M_head_impl + uVar17) + 0xc) = _Var24._M_head_impl[*piVar20];
            dVar28 = quadratic_cost_type<double>::operator()
                               (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                                  *)this)->c,*(int *)(local_88._8_8_ + 4),x);
            _Var12._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            piVar20 = piVar20 + 2;
            uVar15 = uVar17 + 1;
            uVar10 = uVar10 + 1;
            _Var12._M_head_impl[uVar17].value = dVar28 - local_b0;
          } while (piVar20 != (int *)local_88._0_8_);
          _Var24._M_head_impl = local_78._M_head_impl;
          if (uVar17 != 0) {
            __g = ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var12._M_head_impl,_Var12._M_head_impl + (uVar15 & 0xffffffff),
                       (int)LZCOUNT(uVar15 & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var12._M_head_impl,_Var12._M_head_impl + (uVar15 & 0xffffffff));
            _Var24._M_head_impl = local_78._M_head_impl;
            prVar13 = _Var12._M_head_impl + 1;
            lVar19 = uVar23 * 0x10 + -0x10;
            do {
              if (((_Var12._M_head_impl)->value != prVar13->value) ||
                 (NAN((_Var12._M_head_impl)->value) || NAN(prVar13->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var12._M_head_impl,prVar13,__g);
                _Var12._M_head_impl = prVar13;
              }
              prVar13 = prVar13 + 1;
              lVar19 = lVar19 + -0x10;
            } while (lVar19 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var12._M_head_impl,prVar13,__g);
          }
        }
      }
      _Var11._M_head_impl =
           (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
           ._M_head_impl;
      iVar18 = (int)uVar15;
      if (_Var11._M_head_impl[(long)_Var24._M_head_impl].min < 1) {
        lVar19 = 0xffffffff;
LAB_001a1990:
        uVar10 = (uint)lVar19;
        iVar14 = uVar10 + 1;
        if ((iVar14 < iVar18) && (local_b4 <= _Var11._M_head_impl[(long)_Var24._M_head_impl].max)) {
          _Var12._M_head_impl =
               (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                  *)this)->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
               ._M_head_impl;
          lVar25 = (long)(int)uVar10 << 4;
          lVar22 = (long)(int)uVar10 + 1;
          do {
            lVar19 = lVar22;
            _Var11._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
                 ._M_head_impl;
            local_b4 = local_b4 + *(int *)((long)&_Var12._M_head_impl[1].a + lVar25);
            if (local_b4 < _Var11._M_head_impl[(long)_Var24._M_head_impl].min) {
              piVar20 = (int *)(local_88._8_8_ +
                               (long)*(int *)((long)&_Var12._M_head_impl[1].id + lVar25) * 2 * 4);
LAB_001a1a86:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar20[1]);
              _Var6._M_head_impl =
                   (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                   ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = dVar27;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = delta;
              auVar32._8_8_ = 0;
              auVar32._0_8_ =
                   *(double *)
                    ((long)((((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                               *)this)->R)._M_t.
                            super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                            .
                            super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                            ._M_head_impl + 1) + lVar25) * 0.5;
              auVar2 = vfmadd213sd_fma(auVar32,auVar36,auVar5);
              _Var6._M_head_impl[*piVar20] = _Var6._M_head_impl[*piVar20] - auVar2._0_8_;
              break;
            }
            piVar20 = (int *)(local_88._8_8_ +
                             (long)*(int *)((long)&_Var12._M_head_impl[1].id + lVar25) * 2 * 4);
            if (*(int *)((long)(_Var11._M_head_impl + (long)_Var24._M_head_impl) + 4) < local_b4)
            goto LAB_001a1a86;
            dVar28 = *(double *)((long)&_Var12._M_head_impl[1].value + lVar25);
            bVar9 = dVar28 == 0.0;
            bVar26 = dVar28 < 0.0;
            if ((bVar9) && (!NAN(dVar28))) {
              dVar28 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                                    *)this)->rng);
              bVar9 = dVar28 == 0.5;
              bVar26 = 0.5 < dVar28;
            }
            if (bVar26 || bVar9) goto LAB_001a1a86;
            bit_array_impl::set(&x->super_bit_array_impl,piVar20[1]);
            _Var12._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var6._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = dVar27;
            pdVar1 = (double *)((long)&_Var12._M_head_impl[1].value + lVar25);
            lVar25 = lVar25 + 0x10;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = delta;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *pdVar1 * 0.5;
            auVar2 = vfmadd213sd_fma(auVar31,auVar35,auVar4);
            _Var6._M_head_impl[*piVar20] = auVar2._0_8_ + _Var6._M_head_impl[*piVar20];
            lVar22 = lVar19 + 1;
          } while (lVar19 + 1 < (long)iVar18);
          goto LAB_001a1acb;
        }
      }
      else {
        _Var12._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar25 = 0;
        local_48 = (long)iVar18 + -2;
        local_b4 = 0;
        lVar22 = -1;
        do {
          uVar8 = local_88._8_8_;
          lVar21 = (long)*(int *)((long)&(_Var12._M_head_impl)->id + lVar25);
          local_b4 = local_b4 + *(int *)((long)&(_Var12._M_head_impl)->a + lVar25);
          lVar19 = lVar22 + 1;
          iVar14 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                      *)this)->b)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                   .
                   super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
                   ._M_head_impl[(long)_Var24._M_head_impl].min;
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_88._8_8_ + (lVar21 * 2 + 1) * 4));
          auVar34._8_8_ = 0;
          auVar34._0_8_ = dVar27;
          _Var12._M_head_impl =
               (local_70->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
               ._M_head_impl;
          _Var6._M_head_impl =
               (local_70->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
               .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = delta;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(double *)((long)&(_Var12._M_head_impl)->value + lVar25) * 0.5;
          auVar2 = vfmadd213sd_fma(auVar30,auVar34,auVar3);
          _Var6._M_head_impl[*(int *)(uVar8 + lVar21 * 2 * 4)] =
               auVar2._0_8_ + _Var6._M_head_impl[*(int *)(uVar8 + lVar21 * 2 * 4)];
          this = (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                  *)local_70;
          if (iVar14 <= local_b4) break;
          lVar25 = lVar25 + 0x10;
          bVar9 = lVar22 < local_48;
          lVar22 = lVar19;
        } while (bVar9);
        _Var11._M_head_impl =
             (local_70->b)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
             ._M_head_impl;
        if (_Var11._M_head_impl[(long)_Var24._M_head_impl].min <= local_b4) goto LAB_001a1990;
LAB_001a1acb:
        uVar10 = (uint)lVar19;
        iVar14 = uVar10 + 1;
      }
      this = (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
              *)local_70;
      if (iVar14 < iVar18) {
        prVar13 = (local_70->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                  ._M_head_impl;
        lVar19 = (long)(int)uVar10 << 4;
        iVar18 = ~uVar10 + iVar18;
        do {
          uVar8 = local_88._8_8_;
          lVar22 = (long)*(int *)((long)&prVar13[1].id + lVar19);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_88._8_8_ + (lVar22 * 2 + 1) * 4));
          prVar13 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                       *)this)->R)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                    ._M_head_impl;
          pdVar7 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                   ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = dVar27;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = delta;
          pdVar1 = (double *)((long)&prVar13[1].value + lVar19);
          lVar19 = lVar19 + 0x10;
          iVar18 = iVar18 + -1;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *pdVar1 * 0.5;
          auVar2 = vfmadd213sd_fma(auVar33,auVar39,auVar38);
          pdVar7[*(int *)(uVar8 + lVar22 * 2 * 4)] =
               pdVar7[*(int *)(uVar8 + lVar22 * 2 * 4)] - auVar2._0_8_;
        } while (iVar18 != 0);
      }
      bVar9 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                          *)this,(int)local_78._M_head_impl,x);
      if (!bVar9) {
LAB_001a1b8b:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      first._M_current = local_50 + 1;
    } while (first._M_current != (pair<int,_int> *)local_58._M_head_impl);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }